

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

float ncnn::get_value_bounded(Mat *image,int x,int y,int padding_mode,int align_corner)

{
  int in_ECX;
  int in_EDX;
  float in_ESI;
  int in_R8D;
  float fVar1;
  float fVar2;
  
  fVar1 = compute_coord(in_ESI,in_EDX,in_ECX,in_R8D);
  fVar1 = (float)(int)fVar1;
  fVar2 = compute_coord(fVar1,in_EDX,in_ECX,in_R8D);
  fVar1 = get_value_bounded((Mat *)CONCAT44(fVar1,(int)fVar2),in_ECX,in_R8D);
  return fVar1;
}

Assistant:

static float get_value_bounded(const Mat& image, int x, int y, int padding_mode, int align_corner)
{
    x = compute_coord(x, image.w, padding_mode, align_corner);
    y = compute_coord(y, image.h, padding_mode, align_corner);

    return get_value_bounded(image, x, y);
}